

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_fetch_block_scalar(yaml_parser_t *parser,int literal)

{
  size_t *psVar1;
  yaml_char_t **ppyVar2;
  yaml_token_t **tail;
  byte bVar3;
  yaml_char_t yVar4;
  yaml_simple_key_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  undefined4 uVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  byte *pbVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  yaml_token_t *pyVar17;
  yaml_token_t *pyVar18;
  bool bVar19;
  byte bVar20;
  yaml_mark_t start_mark;
  yaml_mark_t end_mark;
  yaml_token_t token;
  int local_12c;
  yaml_char_t *local_128;
  yaml_char_t *pyStack_120;
  yaml_char_t *local_118 [2];
  byte *local_108;
  byte *pbStack_100;
  byte *local_f8;
  int local_ec;
  yaml_string_t local_e8;
  size_t local_c8;
  size_t sStack_c0;
  size_t local_b8;
  int local_ac;
  yaml_mark_t local_a8;
  yaml_token_t local_88;
  
  bVar20 = 0;
  pyVar5 = (parser->simple_keys).top;
  if ((pyVar5[-1].possible != 0) && (pyVar5[-1].required != 0)) {
    sVar12 = pyVar5[-1].mark.column;
    sVar6 = pyVar5[-1].mark.index;
    sVar7 = pyVar5[-1].mark.line;
    parser->error = YAML_SCANNER_ERROR;
    parser->context = "while scanning a simple key";
    (parser->context_mark).index = sVar6;
    (parser->context_mark).line = sVar7;
    (parser->context_mark).column = sVar12;
    parser->problem = "could not find expected \':\'";
    sVar12 = (parser->mark).line;
    (parser->problem_mark).index = (parser->mark).index;
    (parser->problem_mark).line = sVar12;
    (parser->problem_mark).column = (parser->mark).column;
    return 0;
  }
  pyVar5[-1].possible = 0;
  parser->simple_key_allowed = 1;
  local_f8 = (byte *)0x0;
  local_108 = (byte *)0x0;
  pbStack_100 = (byte *)0x0;
  local_118[0] = (yaml_char_t *)0x0;
  local_128 = (yaml_char_t *)0x0;
  pyStack_120 = (yaml_char_t *)0x0;
  local_e8.pointer = (yaml_char_t *)0x0;
  local_e8.start = (yaml_char_t *)0x0;
  local_e8.end = (yaml_char_t *)0x0;
  local_ec = 0;
  local_108 = (byte *)yaml_malloc(0x10);
  if (local_108 != (byte *)0x0) {
    pbStack_100 = local_108 + 0x10;
    local_108[0] = 0;
    local_108[1] = 0;
    local_108[2] = 0;
    local_108[3] = 0;
    local_108[4] = 0;
    local_108[5] = 0;
    local_108[6] = 0;
    local_108[7] = 0;
    local_108[8] = 0;
    local_108[9] = 0;
    local_108[10] = 0;
    local_108[0xb] = 0;
    local_108[0xc] = 0;
    local_108[0xd] = 0;
    local_108[0xe] = 0;
    local_108[0xf] = 0;
    local_f8 = local_108;
    local_128 = (yaml_char_t *)yaml_malloc(0x10);
    if (local_128 != (yaml_char_t *)0x0) {
      pyStack_120 = local_128 + 0x10;
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = '\0';
      local_128[9] = '\0';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_118[0] = local_128;
      local_e8.start = (yaml_char_t *)yaml_malloc(0x10);
      if (local_e8.start != (yaml_char_t *)0x0) {
        local_e8.end = local_e8.start + 0x10;
        local_e8.start[0] = '\0';
        local_e8.start[1] = '\0';
        local_e8.start[2] = '\0';
        local_e8.start[3] = '\0';
        local_e8.start[4] = '\0';
        local_e8.start[5] = '\0';
        local_e8.start[6] = '\0';
        local_e8.start[7] = '\0';
        local_e8.start[8] = '\0';
        local_e8.start[9] = '\0';
        local_e8.start[10] = '\0';
        local_e8.start[0xb] = '\0';
        local_e8.start[0xc] = '\0';
        local_e8.start[0xd] = '\0';
        local_e8.start[0xe] = '\0';
        local_e8.start[0xf] = '\0';
        local_b8 = (parser->mark).column;
        local_c8 = (parser->mark).index;
        sStack_c0 = (parser->mark).line;
        (parser->mark).index = (parser->mark).index + 1;
        psVar1 = &(parser->mark).column;
        *psVar1 = *psVar1 + 1;
        pbVar13 = (parser->buffer).pointer;
        sVar12 = parser->unread - 1;
        parser->unread = sVar12;
        bVar9 = *pbVar13;
        lVar16 = 1;
        if ((((char)bVar9 < '\0') && (lVar16 = 2, (bVar9 & 0xe0) != 0xc0)) &&
           (lVar16 = 3, (bVar9 & 0xf0) != 0xe0)) {
          lVar16 = (ulong)((bVar9 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar13 + lVar16;
        local_e8.pointer = local_e8.start;
        if ((sVar12 == 0) && (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0))
        goto LAB_0010c782;
        pbVar13 = (parser->buffer).pointer;
        bVar9 = *pbVar13;
        if ((bVar9 == 0x2d) || (bVar9 == 0x2b)) {
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          sVar12 = parser->unread - 1;
          parser->unread = sVar12;
          bVar3 = *pbVar13;
          lVar16 = 1;
          if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
             (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
            lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar13 + lVar16;
          if ((sVar12 == 0) && (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0))
          goto LAB_0010c782;
          local_12c = (uint)(bVar9 == 0x2b) * 2 + -1;
          pbVar13 = (parser->buffer).pointer;
          bVar9 = *pbVar13;
          iVar10 = 0;
          if ((byte)(bVar9 - 0x30) < 10) {
            if (bVar9 == 0x30) goto LAB_0010babf;
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
            bVar3 = *pbVar13;
            lVar16 = 1;
            if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
               (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
              lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
            }
            iVar10 = bVar9 - 0x30;
            pbVar13 = pbVar13 + lVar16;
LAB_0010bc20:
            (parser->buffer).pointer = pbVar13;
          }
LAB_0010bc27:
          if ((parser->unread != 0) || (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 != 0))
          {
            do {
              pbVar13 = (parser->buffer).pointer;
              bVar9 = *pbVar13;
              if ((bVar9 != 9) && (bVar9 != 0x20)) {
                if (bVar9 != 0x23) goto LAB_0010bdf3;
                goto LAB_0010bd00;
              }
              (parser->mark).index = (parser->mark).index + 1;
              psVar1 = &(parser->mark).column;
              *psVar1 = *psVar1 + 1;
              sVar12 = parser->unread - 1;
              parser->unread = sVar12;
              bVar9 = *pbVar13;
              lVar16 = 1;
              if ((((char)bVar9 < '\0') && (lVar16 = 2, (bVar9 & 0xe0) != 0xc0)) &&
                 (lVar16 = 3, (bVar9 & 0xf0) != 0xe0)) {
                lVar16 = (ulong)((bVar9 & 0xf8) == 0xf0) << 2;
              }
              (parser->buffer).pointer = pbVar13 + lVar16;
            } while ((sVar12 != 0) || (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 != 0));
          }
          goto LAB_0010c782;
        }
        if (9 < (byte)(bVar9 - 0x30)) {
          local_12c = 0;
          iVar10 = 0;
          goto LAB_0010bc27;
        }
        if (bVar9 != 0x30) {
          local_12c = 0;
          (parser->mark).index = (parser->mark).index + 1;
          psVar1 = &(parser->mark).column;
          *psVar1 = *psVar1 + 1;
          sVar12 = parser->unread - 1;
          parser->unread = sVar12;
          bVar3 = *pbVar13;
          lVar16 = 1;
          if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
             (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
            lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar13 + lVar16;
          if ((sVar12 == 0) && (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0))
          goto LAB_0010c782;
          iVar10 = bVar9 - 0x30;
          pbVar13 = (parser->buffer).pointer;
          bVar9 = *pbVar13;
          if ((bVar9 == 0x2d) || (bVar9 == 0x2b)) {
            (parser->mark).index = (parser->mark).index + 1;
            psVar1 = &(parser->mark).column;
            *psVar1 = *psVar1 + 1;
            parser->unread = parser->unread - 1;
            bVar3 = *pbVar13;
            lVar16 = 1;
            if ((((char)bVar3 < '\0') && (lVar16 = 2, (bVar3 & 0xe0) != 0xc0)) &&
               (lVar16 = 3, (bVar3 & 0xf0) != 0xe0)) {
              lVar16 = (ulong)((bVar3 & 0xf8) == 0xf0) << 2;
            }
            local_12c = (uint)(bVar9 == 0x2b) * 2 + -1;
            pbVar13 = pbVar13 + lVar16;
            goto LAB_0010bc20;
          }
          goto LAB_0010bc27;
        }
LAB_0010babf:
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a block scalar";
        (parser->context_mark).index = local_c8;
        (parser->context_mark).line = sStack_c0;
        (parser->context_mark).column = local_b8;
        pcVar14 = "found an indentation indicator equal to 0";
LAB_0010bfda:
        parser->problem = pcVar14;
        sVar12 = (parser->mark).line;
        (parser->problem_mark).index = (parser->mark).index;
        (parser->problem_mark).line = sVar12;
        (parser->problem_mark).column = (parser->mark).column;
        goto LAB_0010c782;
      }
    }
  }
LAB_0010c77c:
  parser->error = YAML_MEMORY_ERROR;
  goto LAB_0010c782;
LAB_0010bd00:
  pbVar13 = (parser->buffer).pointer;
  bVar9 = *pbVar13;
  if (bVar9 == 0xc2) {
    if (pbVar13[1] == 0x85) goto LAB_0010bdf3;
LAB_0010bd5d:
    if (bVar9 == 0) goto LAB_0010bdf3;
LAB_0010bd65:
    (parser->mark).index = (parser->mark).index + 1;
    psVar1 = &(parser->mark).column;
    *psVar1 = *psVar1 + 1;
    sVar12 = parser->unread - 1;
    parser->unread = sVar12;
    bVar9 = *pbVar13;
    lVar16 = 1;
    if ((((char)bVar9 < '\0') && (lVar16 = 2, (bVar9 & 0xe0) != 0xc0)) &&
       (lVar16 = 3, (bVar9 & 0xf0) != 0xe0)) {
      lVar16 = (ulong)((bVar9 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar13 + lVar16;
    if ((sVar12 != 0) || (iVar11 = yaml_parser_update_buffer(parser,1), iVar11 != 0))
    goto LAB_0010bd00;
    goto LAB_0010c782;
  }
  if (bVar9 != 0xe2) {
    if ((bVar9 < 0xe) && ((0x2401U >> (bVar9 & 0x1f) & 1) != 0)) goto LAB_0010bdf3;
    goto LAB_0010bd65;
  }
  if ((pbVar13[1] != 0x80) || (pbVar13[2] != 0xa8)) goto LAB_0010bd5d;
LAB_0010bdf3:
  pbVar13 = (parser->buffer).pointer;
  bVar9 = *pbVar13;
  if (bVar9 < 0xd) {
    if (bVar9 == 0) goto LAB_0010c076;
    if (bVar9 != 10) goto LAB_0010bfaa;
LAB_0010be77:
    if ((parser->unread < 2) && (iVar11 = yaml_parser_update_buffer(parser,2), iVar11 == 0))
    goto LAB_0010c782;
    pbVar13 = (parser->buffer).pointer;
    bVar9 = *pbVar13;
    if (bVar9 < 0xc2) {
      if (bVar9 == 10) goto LAB_0010c00b;
      if (bVar9 != 0xd) goto LAB_0010c076;
      if (pbVar13[1] != 10) goto LAB_0010c00b;
      (parser->mark).index = (parser->mark).index + 2;
      (parser->mark).column = 0;
      psVar1 = &(parser->mark).line;
      *psVar1 = *psVar1 + 1;
      parser->unread = parser->unread - 2;
      lVar16 = 2;
    }
    else {
      if (((bVar9 != 0xc2) || (pbVar13[1] != 0x85)) &&
         ((bVar9 != 0xe2 || ((pbVar13[1] != 0x80 || (pbVar13[2] != 0xa8)))))) goto LAB_0010c076;
LAB_0010c00b:
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 0;
      psVar1 = &(parser->mark).line;
      *psVar1 = *psVar1 + 1;
      parser->unread = parser->unread - 1;
      bVar9 = *pbVar13;
      lVar16 = 1;
      if ((((char)bVar9 < '\0') && (lVar16 = 2, (bVar9 & 0xe0) != 0xc0)) &&
         (lVar16 = 3, (bVar9 & 0xf0) != 0xe0)) {
        lVar16 = (ulong)((bVar9 & 0xf8) == 0xf0) << 2;
      }
    }
    (parser->buffer).pointer = pbVar13 + lVar16;
  }
  else {
    if (bVar9 == 0xd) goto LAB_0010be77;
    if (bVar9 != 0xe2) {
      if ((bVar9 == 0xc2) && (pbVar13[1] == 0x85)) goto LAB_0010be4b;
LAB_0010bfaa:
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a block scalar";
      (parser->context_mark).index = local_c8;
      (parser->context_mark).line = sStack_c0;
      (parser->context_mark).column = local_b8;
      pcVar14 = "did not find expected comment or line break";
      goto LAB_0010bfda;
    }
    if ((pbVar13[1] != 0x80) || (pbVar13[2] != 0xa8)) goto LAB_0010bfaa;
LAB_0010be4b:
    if (bVar9 < 0xc2) {
      if ((bVar9 == 10) || (bVar9 == 0xd)) goto LAB_0010be77;
    }
    else if (bVar9 == 0xe2) {
      if ((pbVar13[1] == 0x80) && (pbVar13[2] == 0xa8)) goto LAB_0010be77;
    }
    else if ((bVar9 == 0xc2) && (pbVar13[1] == 0x85)) goto LAB_0010be77;
  }
LAB_0010c076:
  local_a8.column = (parser->mark).column;
  local_a8.index = (parser->mark).index;
  local_a8.line = (parser->mark).line;
  if (iVar10 != 0) {
    local_ec = 0;
    if (0 < parser->indent) {
      local_ec = parser->indent;
    }
    local_ec = local_ec + iVar10;
  }
  start_mark_00.line = sStack_c0;
  start_mark_00.index = local_c8;
  start_mark_00.column = local_b8;
  iVar10 = yaml_parser_scan_block_scalar_breaks(parser,&local_ec,&local_e8,start_mark_00,&local_a8);
  if ((iVar10 != 0) &&
     ((parser->unread != 0 || (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 != 0)))) {
    bVar19 = false;
    local_ac = literal;
    do {
      if (local_ec != (int)(parser->mark).column) {
LAB_0010c5eb:
        if (local_12c != -1) {
          iVar10 = yaml_string_join(&local_108,&local_f8,&pbStack_100,&local_128,local_118,
                                    &pyStack_120);
          if (iVar10 == 0) goto LAB_0010c77c;
          local_118[0] = local_128;
          if (local_12c == 1) {
            iVar10 = yaml_string_join(&local_108,&local_f8,&pbStack_100,&local_e8.start,
                                      &local_e8.pointer,&local_e8.end);
            if (iVar10 == 0) goto LAB_0010c77c;
            local_e8.pointer = local_e8.start;
          }
        }
        local_88.type = YAML_SCALAR_TOKEN;
        local_88._4_4_ = 0;
        local_88.start_mark.index = local_c8;
        local_88.start_mark.line = sStack_c0;
        local_88.start_mark.column = local_b8;
        local_88.end_mark.index = local_a8.index;
        local_88.end_mark.line = local_a8.line;
        local_88.end_mark.column = local_a8.column;
        local_88.data.tag.handle = local_108;
        local_88.data.tag.suffix = local_f8 + -(long)local_108;
        local_88.data._20_4_ = 0;
        local_88.data.scalar.style = (literal == 0) + 4;
        yaml_free(local_128);
        local_128 = (yaml_char_t *)0x0;
        pyStack_120 = (yaml_char_t *)0x0;
        local_118[0] = (yaml_char_t *)0x0;
        yaml_free(local_e8.start);
        tail = &(parser->tokens).tail;
        if (((parser->tokens).tail == (parser->tokens).end) &&
           (iVar10 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,
                                       &(parser->tokens).end), iVar10 == 0)) {
          parser->error = YAML_MEMORY_ERROR;
          yaml_token_delete(&local_88);
          return 0;
        }
        pyVar18 = *tail;
        *tail = pyVar18 + 1;
        pyVar17 = &local_88;
        for (lVar16 = 10; lVar16 != 0; lVar16 = lVar16 + -1) {
          uVar8 = *(undefined4 *)&pyVar17->field_0x4;
          pyVar18->type = pyVar17->type;
          *(undefined4 *)&pyVar18->field_0x4 = uVar8;
          pyVar17 = (yaml_token_t *)((long)pyVar17 + ((ulong)bVar20 * -2 + 1) * 8);
          pyVar18 = (yaml_token_t *)((long)pyVar18 + (ulong)bVar20 * -0x10 + 8);
        }
        return 1;
      }
      yVar4 = *(parser->buffer).pointer;
      bVar9 = 1;
      if ((yVar4 != '\t') && (yVar4 != ' ')) {
        if (yVar4 == '\0') goto LAB_0010c5eb;
        bVar9 = 0;
      }
      if ((literal != 0) || ((bool)(bVar9 | bVar19) || *local_128 != '\n')) {
        iVar10 = yaml_string_join(&local_108,&local_f8,&pbStack_100,&local_128,local_118,
                                  &pyStack_120);
        if (iVar10 == 0) goto LAB_0010c77c;
      }
      else if (*local_e8.start == '\0') {
        if ((pbStack_100 <= local_f8 + 5) &&
           (iVar10 = yaml_string_extend(&local_108,&local_f8,&pbStack_100), iVar10 == 0))
        goto LAB_0010c77c;
        *local_f8 = 0x20;
        local_f8 = local_f8 + 1;
      }
      local_118[0] = local_128;
      memset(local_128,0,(long)pyStack_120 - (long)local_128);
      iVar10 = yaml_string_join(&local_108,&local_f8,&pbStack_100,&local_e8.start,&local_e8.pointer,
                                &local_e8.end);
      if (iVar10 == 0) goto LAB_0010c77c;
      local_e8.pointer = local_e8.start;
      memset(local_e8.start,0,(long)local_e8.end - (long)local_e8.start);
      literal = local_ac;
      yVar4 = *(parser->buffer).pointer;
      bVar19 = yVar4 == '\t' || yVar4 == ' ';
LAB_0010c20e:
      pbVar13 = (parser->buffer).pointer;
      bVar9 = *pbVar13;
      if (bVar9 == 0xc2) {
        if (pbVar13[1] == 0x85) goto LAB_0010c395;
LAB_0010c26c:
        if (bVar9 == 0) goto LAB_0010c395;
LAB_0010c274:
        if ((pbStack_100 <= local_f8 + 5) &&
           (iVar10 = yaml_string_extend(&local_108,&local_f8,&pbStack_100), iVar10 == 0))
        goto LAB_0010c77c;
        pbVar13 = (parser->buffer).pointer;
        bVar9 = *pbVar13;
        if ((char)bVar9 < '\0') {
          if ((bVar9 & 0xe0) == 0xc0) {
LAB_0010c31f:
            (parser->buffer).pointer = pbVar13 + 1;
            *local_f8 = *pbVar13;
            pbVar13 = (parser->buffer).pointer;
            local_f8 = local_f8 + 1;
            goto LAB_0010c343;
          }
          if ((bVar9 & 0xf0) == 0xe0) {
LAB_0010c2fb:
            (parser->buffer).pointer = pbVar13 + 1;
            *local_f8 = *pbVar13;
            pbVar13 = (parser->buffer).pointer;
            local_f8 = local_f8 + 1;
            goto LAB_0010c31f;
          }
          if ((bVar9 & 0xf8) == 0xf0) {
            (parser->buffer).pointer = pbVar13 + 1;
            *local_f8 = *pbVar13;
            pbVar13 = (parser->buffer).pointer;
            local_f8 = local_f8 + 1;
            goto LAB_0010c2fb;
          }
        }
        else {
LAB_0010c343:
          (parser->buffer).pointer = pbVar13 + 1;
          *local_f8 = *pbVar13;
          local_f8 = local_f8 + 1;
        }
        (parser->mark).index = (parser->mark).index + 1;
        psVar1 = &(parser->mark).column;
        *psVar1 = *psVar1 + 1;
        psVar1 = &parser->unread;
        *psVar1 = *psVar1 - 1;
        if ((*psVar1 == 0) && (iVar10 = yaml_parser_update_buffer(parser,1), iVar10 == 0)) break;
        goto LAB_0010c20e;
      }
      if (bVar9 != 0xe2) {
        if ((bVar9 < 0xe) && ((0x2401U >> (bVar9 & 0x1f) & 1) != 0)) goto LAB_0010c395;
        goto LAB_0010c274;
      }
      if ((pbVar13[1] != 0x80) || (pbVar13[2] != 0xa8)) goto LAB_0010c26c;
LAB_0010c395:
      if ((parser->unread < 2) && (iVar10 = yaml_parser_update_buffer(parser,2), iVar10 == 0))
      break;
      if ((pyStack_120 <= local_118[0] + 5) &&
         (iVar10 = yaml_string_extend(&local_128,local_118,&pyStack_120), iVar10 == 0))
      goto LAB_0010c77c;
      pbVar13 = (parser->buffer).pointer;
      bVar9 = *pbVar13;
      if (bVar9 < 0xc2) {
        if (bVar9 == 10) {
LAB_0010c4ad:
          *local_118[0] = '\n';
          ppyVar2 = &(parser->buffer).pointer;
          *ppyVar2 = *ppyVar2 + 1;
LAB_0010c581:
          lVar16 = -1;
          lVar15 = 1;
        }
        else {
          if (bVar9 != 0xd) goto LAB_0010c5ad;
          if (pbVar13[1] != 10) goto LAB_0010c4ad;
          *local_118[0] = '\n';
          ppyVar2 = &(parser->buffer).pointer;
          *ppyVar2 = *ppyVar2 + 2;
          lVar16 = -2;
          lVar15 = 2;
        }
        local_118[0] = local_118[0] + 1;
        (parser->mark).index = (parser->mark).index + lVar15;
        (parser->mark).column = 0;
        psVar1 = &(parser->mark).line;
        *psVar1 = *psVar1 + 1;
        parser->unread = parser->unread + lVar16;
      }
      else if ((bVar9 == 0xc2) && (pbVar13[1] == 0x85)) {
        *local_118[0] = '\n';
        ppyVar2 = &(parser->buffer).pointer;
        *ppyVar2 = *ppyVar2 + 2;
        goto LAB_0010c581;
      }
LAB_0010c5ad:
      start_mark_01.line = sStack_c0;
      start_mark_01.index = local_c8;
      start_mark_01.column = local_b8;
      iVar10 = yaml_parser_scan_block_scalar_breaks
                         (parser,&local_ec,&local_e8,start_mark_01,&local_a8);
    } while (iVar10 != 0);
  }
LAB_0010c782:
  yaml_free(local_108);
  local_f8 = (byte *)0x0;
  local_108 = (byte *)0x0;
  pbStack_100 = (byte *)0x0;
  yaml_free(local_128);
  local_118[0] = (yaml_char_t *)0x0;
  local_128 = (yaml_char_t *)0x0;
  pyStack_120 = (yaml_char_t *)0x0;
  yaml_free(local_e8.start);
  return 0;
}

Assistant:

static int
yaml_parser_fetch_block_scalar(yaml_parser_t *parser, int literal)
{
    yaml_token_t token;

    /* Remove any potential simple keys. */

    if (!yaml_parser_remove_simple_key(parser))
        return 0;

    /* A simple key may follow a block scalar. */

    parser->simple_key_allowed = 1;

    /* Create the SCALAR token and append it to the queue. */

    if (!yaml_parser_scan_block_scalar(parser, &token, literal))
        return 0;

    if (!ENQUEUE(parser, parser->tokens, token)) {
        yaml_token_delete(&token);
        return 0;
    }

    return 1;
}